

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

cni_holder_base *
cs_impl::cni::construct_helper<void(*)(std::shared_ptr<std::ostream>&,char)>::
_construct<void(&)(std::shared_ptr<std::ostream>&,char),void,std::shared_ptr<std::ostream>&,char>
          (_func_void_shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_ptr_char *val,
          _func_void_shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_ptr_char
          *target_function)

{
  cni_holder_base *pcVar1;
  _func_void_shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_ptr_char
  **in_stack_00000008;
  cni_holder<void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_char),_void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_char)>
  *in_stack_00000010;
  _func_void_shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_ptr_char
  *in_stack_ffffffffffffffc8;
  _func_void_shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_ptr_char
  *in_stack_ffffffffffffffd0;
  
  check_conversion<void,void,std::shared_ptr<std::ostream>&,char,std::shared_ptr<std::ostream>&,char>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  pcVar1 = (cni_holder_base *)operator_new(0x28);
  cni_holder<void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_char),_void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_char)>
  ::cni_holder(in_stack_00000010,in_stack_00000008);
  return pcVar1;
}

Assistant:

static cni_holder_base *_construct(X &&val, RetT(*target_function)(ArgsT...))
			{
				using source_function_type = typename type_conversion_cpp<RetT>::target_type(*)(
				                                 typename type_conversion_cs<ArgsT>::source_type...);
				// Return type
				static_assert(cni_convertible<RetT, typename type_conversion_cpp<RetT>::target_type>::value,
				              "Invalid conversion.");
				// Argument type
				check_conversion(target_function, source_function_type(nullptr));
				return new cni_holder<T, source_function_type>(std::forward<X>(val));
			}